

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::checkStageIO(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  int iVar1;
  TIntermAggregate *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  pointer ppTVar4;
  long lVar5;
  pointer ppTVar6;
  pointer ppTVar7;
  long lVar8;
  TIntermSequence unitLinkerObjects;
  TIntermSequence linkerObjects;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> local_70;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> local_50;
  
  if (unit->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  if (this->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  pTVar2 = findLinkerObjects(this);
  iVar1 = (*(pTVar2->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar2);
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::vector
            (&local_50,
             (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             CONCAT44(extraout_var,iVar1));
  pTVar2 = findLinkerObjects(unit);
  iVar1 = (*(pTVar2->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar2);
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::vector
            (&local_70,
             (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             CONCAT44(extraout_var_00,iVar1));
  lVar8 = (long)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  ppTVar6 = local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar8 >> 5) {
    lVar5 = (lVar8 >> 5) + 1;
    ppTVar7 = local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start + 2;
    do {
      ppTVar6 = ppTVar7;
      iVar1 = (*ppTVar6[-2]->_vptr_TIntermNode[0xc])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_01,iVar1));
      if ((*(uint *)(lVar3 + 8) & 0x7f) != 4) {
        ppTVar6 = ppTVar6 + -2;
        goto LAB_003672d2;
      }
      iVar1 = (*ppTVar6[-1]->_vptr_TIntermNode[0xc])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_02,iVar1));
      if ((*(uint *)(lVar3 + 8) & 0x7f) != 4) {
        ppTVar6 = ppTVar6 + -1;
        goto LAB_003672d2;
      }
      iVar1 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_03,iVar1));
      if ((*(uint *)(lVar3 + 8) & 0x7f) != 4) goto LAB_003672d2;
      iVar1 = (*ppTVar6[1]->_vptr_TIntermNode[0xc])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_04,iVar1));
      if ((*(uint *)(lVar3 + 8) & 0x7f) != 4) {
        ppTVar6 = ppTVar6 + 1;
        goto LAB_003672d2;
      }
      lVar5 = lVar5 + -1;
      lVar8 = lVar8 + -0x20;
      ppTVar7 = ppTVar6 + 4;
    } while (1 < lVar5);
    ppTVar6 = ppTVar6 + 2;
  }
  lVar8 = lVar8 >> 3;
  if (lVar8 == 1) {
LAB_00367298:
    iVar1 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar1) + 0x108))
                      ((long *)CONCAT44(extraout_var_07,iVar1));
    if ((*(uint *)(lVar8 + 8) & 0x7f) == 4) {
      ppTVar6 = local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
LAB_003672d2:
    ppTVar4 = ppTVar6 + 1;
    ppTVar7 = ppTVar6;
    if (ppTVar4 !=
        local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish &&
        ppTVar6 !=
        local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        iVar1 = (*(*ppTVar4)->_vptr_TIntermNode[0xc])();
        lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar1) + 0x108))
                          ((long *)CONCAT44(extraout_var_08,iVar1));
        if ((*(uint *)(lVar8 + 8) & 0x7f) == 4) {
          *ppTVar6 = *ppTVar4;
          ppTVar6 = ppTVar6 + 1;
        }
        ppTVar4 = ppTVar4 + 1;
        ppTVar7 = ppTVar6;
      } while (ppTVar4 !=
               local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    if (lVar8 == 2) {
LAB_00367273:
      iVar1 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_06,iVar1));
      if ((*(uint *)(lVar8 + 8) & 0x7f) == 4) {
        ppTVar6 = ppTVar6 + 1;
        goto LAB_00367298;
      }
      goto LAB_003672d2;
    }
    ppTVar7 = local_50.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (lVar8 == 3) {
      iVar1 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_05,iVar1));
      if ((*(uint *)(lVar8 + 8) & 0x7f) == 4) {
        ppTVar6 = ppTVar6 + 1;
        goto LAB_00367273;
      }
      goto LAB_003672d2;
    }
  }
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::resize
            (&local_50,
             (long)ppTVar7 -
             (long)local_50.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  lVar8 = (long)local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  ppTVar6 = local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar8 >> 5) {
    lVar5 = (lVar8 >> 5) + 1;
    ppTVar7 = local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start + 2;
    do {
      ppTVar6 = ppTVar7;
      iVar1 = (*ppTVar6[-2]->_vptr_TIntermNode[0xc])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_09,iVar1));
      if ((*(uint *)(lVar3 + 8) & 0x7f) != 3) {
        ppTVar6 = ppTVar6 + -2;
        goto LAB_003674bf;
      }
      iVar1 = (*ppTVar6[-1]->_vptr_TIntermNode[0xc])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_10,iVar1));
      if ((*(uint *)(lVar3 + 8) & 0x7f) != 3) {
        ppTVar6 = ppTVar6 + -1;
        goto LAB_003674bf;
      }
      iVar1 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_11,iVar1));
      if ((*(uint *)(lVar3 + 8) & 0x7f) != 3) goto LAB_003674bf;
      iVar1 = (*ppTVar6[1]->_vptr_TIntermNode[0xc])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_12,iVar1));
      if ((*(uint *)(lVar3 + 8) & 0x7f) != 3) {
        ppTVar6 = ppTVar6 + 1;
        goto LAB_003674bf;
      }
      lVar5 = lVar5 + -1;
      lVar8 = lVar8 + -0x20;
      ppTVar7 = ppTVar6 + 4;
    } while (1 < lVar5);
    ppTVar6 = ppTVar6 + 2;
  }
  lVar8 = lVar8 >> 3;
  if (lVar8 == 1) {
LAB_00367489:
    iVar1 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar1) + 0x108))
                      ((long *)CONCAT44(extraout_var_15,iVar1));
    if ((*(uint *)(lVar8 + 8) & 0x7f) == 3) {
      ppTVar6 = local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else if (lVar8 == 2) {
LAB_0036745e:
    iVar1 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar1) + 0x108))
                      ((long *)CONCAT44(extraout_var_14,iVar1));
    if ((*(uint *)(lVar8 + 8) & 0x7f) == 3) {
      ppTVar6 = ppTVar6 + 1;
      goto LAB_00367489;
    }
  }
  else {
    ppTVar7 = local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (lVar8 != 3) goto LAB_00367508;
    iVar1 = (*(*ppTVar6)->_vptr_TIntermNode[0xc])();
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar1) + 0x108))
                      ((long *)CONCAT44(extraout_var_13,iVar1));
    if ((*(uint *)(lVar8 + 8) & 0x7f) == 3) {
      ppTVar6 = ppTVar6 + 1;
      goto LAB_0036745e;
    }
  }
LAB_003674bf:
  ppTVar4 = ppTVar6 + 1;
  ppTVar7 = ppTVar6;
  if (ppTVar4 !=
      local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish &&
      ppTVar6 !=
      local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar1 = (*(*ppTVar4)->_vptr_TIntermNode[0xc])();
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar1) + 0x108))
                        ((long *)CONCAT44(extraout_var_16,iVar1));
      if ((*(uint *)(lVar8 + 8) & 0x7f) == 3) {
        *ppTVar6 = *ppTVar4;
        ppTVar6 = ppTVar6 + 1;
      }
      ppTVar4 = ppTVar4 + 1;
      ppTVar7 = ppTVar6;
    } while (ppTVar4 !=
             local_70.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
LAB_00367508:
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::resize
            (&local_70,
             (long)ppTVar7 -
             (long)local_70.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  mergeLinkerObjects(this,infoSink,(TIntermSequence *)&local_50,(TIntermSequence *)&local_70,
                     unit->language);
  return;
}

Assistant:

void TIntermediate::checkStageIO(TInfoSink& infoSink, TIntermediate& unit) {
    if (unit.treeRoot == nullptr || treeRoot == nullptr)
        return;

    // Get copies of the linker-object lists
    TIntermSequence linkerObjects = findLinkerObjects()->getSequence();
    TIntermSequence unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // filter linkerObjects to only contain out variables
    auto end = std::remove_if(linkerObjects.begin(), linkerObjects.end(),
        [](TIntermNode* node) {return node->getAsSymbolNode()->getQualifier().storage != EvqVaryingOut; });
    linkerObjects.resize(end - linkerObjects.begin());

    // filter unitLinkerObjects to only contain in variables
    auto unitEnd = std::remove_if(unitLinkerObjects.begin(), unitLinkerObjects.end(),
        [](TIntermNode* node) {return node->getAsSymbolNode()->getQualifier().storage != EvqVaryingIn; });
    unitLinkerObjects.resize(unitEnd - unitLinkerObjects.begin());

    // do matching and error checking
    mergeLinkerObjects(infoSink, linkerObjects, unitLinkerObjects, unit.getStage());

    // TODO: final check; make sure that any statically used `in` have matching `out` written to
}